

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_color nk_hsva_f(float h,float s,float v,float a)

{
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  int i;
  float f;
  float t;
  float q;
  float p;
  nk_colorf out;
  float local_24;
  float local_20;
  float local_1c;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  nk_color local_4;
  
  local_14 = in_XMM3_Da;
  local_10 = in_XMM2_Da;
  local_c = in_XMM1_Da;
  local_8 = in_XMM0_Da;
  memset(&local_24,0,0x10);
  if (local_c <= 0.0) {
    local_24 = local_10;
    local_20 = local_10;
    local_1c = local_10;
    local_4 = nk_rgb_f(local_10,local_10,local_10);
  }
  else {
    local_8 = local_8 / 0.16666667;
    fVar1 = local_8 - (float)(int)local_8;
    fVar2 = local_10 * (1.0 - local_c);
    local_1c = local_10 * (1.0 - local_c * fVar1);
    fVar1 = local_10 * (1.0 - local_c * (1.0 - fVar1));
    local_20 = fVar2;
    switch((int)local_8) {
    case 0:
      local_24 = local_10;
      local_20 = fVar1;
      local_1c = fVar2;
      break;
    case 1:
      local_20 = local_10;
      local_24 = local_1c;
      local_1c = fVar2;
      break;
    case 2:
      local_20 = local_10;
      local_24 = fVar2;
      local_1c = fVar1;
      break;
    case 4:
      local_1c = local_10;
      local_24 = fVar1;
      break;
    case 5:
    default:
      local_24 = local_10;
    }
    local_4 = nk_rgba_f(local_24,local_20,local_1c,local_14);
  }
  return local_4;
}

Assistant:

NK_API struct nk_color
nk_hsva_f(float h, float s, float v, float a)
{
    struct nk_colorf out = {0,0,0,0};
    float p, q, t, f;
    int i;

    if (s <= 0.0f) {
        out.r = v; out.g = v; out.b = v;
        return nk_rgb_f(out.r, out.g, out.b);
    }

    h = h / (60.0f/360.0f);
    i = (int)h;
    f = h - (float)i;
    p = v * (1.0f - s);
    q = v * (1.0f - (s * f));
    t = v * (1.0f - s * (1.0f - f));

    switch (i) {
    case 0: out.r = v; out.g = t; out.b = p; break;
    case 1: out.r = q; out.g = v; out.b = p; break;
    case 2: out.r = p; out.g = v; out.b = t; break;
    case 4: out.r = t; out.g = p; out.b = v; break;
    case 5: default: out.r = v; out.g = p; out.b = q; break;
    }
    return nk_rgba_f(out.r, out.g, out.b, a);
}